

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

void helper_store_601_batl_ppc64(CPUPPCState_conflict2 *env,uint32_t nr,target_ulong value)

{
  _func_void_DisasContext_ptr_int_int **pp_Var1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  target_ulong tVar5;
  ulong uVar6;
  CPUPPCState_conflict2 *__mptr;
  
  uVar6 = (ulong)nr;
  uVar2 = env->pb[uVar6 - 0xd];
  if (uVar2 != value) {
    if ((uVar2 & 0x40) != 0) {
      uVar3 = ((uint)uVar2 & 0x7ff) << 0x11;
      pp_Var1 = &env[-1].spr_cb[0x1bf].oea_write;
      if (uVar3 < 0x3e1000) {
        tVar5 = env->IBAT[0][uVar6] & 0xfffffffffffe0000;
        lVar4 = (ulong)uVar3 + 0x20000;
        do {
          tlb_flush_page_ppc64((CPUState *)pp_Var1,tVar5);
          tVar5 = tVar5 + 0x1000;
          lVar4 = lVar4 + -0x1000;
        } while (lVar4 != 0);
      }
      else {
        tlb_flush_ppc64((CPUState *)pp_Var1);
      }
    }
    if ((value & 0x40) != 0) {
      uVar3 = ((uint)value & 0x7ff) << 0x11;
      pp_Var1 = &env[-1].spr_cb[0x1bf].oea_write;
      if (uVar3 < 0x3e1000) {
        tVar5 = env->IBAT[0][uVar6] & 0xfffffffffffe0000;
        lVar4 = (ulong)uVar3 + 0x20000;
        do {
          tlb_flush_page_ppc64((CPUState *)pp_Var1,tVar5);
          tVar5 = tVar5 + 0x1000;
          lVar4 = lVar4 + -0x1000;
        } while (lVar4 != 0);
      }
      else {
        tlb_flush_ppc64((CPUState *)pp_Var1);
      }
    }
    env->pb[uVar6 - 0xd] = value;
    env->DBAT[1][uVar6] = value;
  }
  return;
}

Assistant:

void helper_store_601_batl(CPUPPCState *env, uint32_t nr, target_ulong value)
{
#if !defined(FLUSH_ALL_TLBS)
    target_ulong mask;
#else
    PowerPCCPU *cpu = env_archcpu(env);
    int do_inval;
#endif

    dump_store_bat(env, 'I', 1, nr, value);
    if (env->IBAT[1][nr] != value) {
#if defined(FLUSH_ALL_TLBS)
        do_inval = 0;
#endif
        if (env->IBAT[1][nr] & 0x40) {
#if !defined(FLUSH_ALL_TLBS)
            mask = (env->IBAT[1][nr] << 17) & 0x0FFE0000UL;
            do_invalidate_BAT(env, env->IBAT[0][nr], mask);
#else
            do_inval = 1;
#endif
        }
        if (value & 0x40) {
#if !defined(FLUSH_ALL_TLBS)
            mask = (value << 17) & 0x0FFE0000UL;
            do_invalidate_BAT(env, env->IBAT[0][nr], mask);
#else
            do_inval = 1;
#endif
        }
        env->IBAT[1][nr] = value;
        env->DBAT[1][nr] = value;
#if defined(FLUSH_ALL_TLBS)
        if (do_inval) {
            tlb_flush(env_cpu(env));
        }
#endif
    }
}